

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int vdbePmaReaderSeek(SortSubtask *pTask,PmaReader *pReadr,SorterFile *pFile,i64 iOff)

{
  sqlite3_file *psVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  u8 *puVar5;
  long lVar6;
  
  if ((sqlite3Config.xTestCallback != (_func_int_int *)0x0) &&
     (iVar3 = (*sqlite3Config.xTestCallback)(0xc9), iVar3 != 0)) {
    return 0x10a;
  }
  if (pReadr->aMap != (u8 *)0x0) {
    (*pReadr->pFd->pMethods->xUnfetch)(pReadr->pFd,0,pReadr->aMap);
    pReadr->aMap = (u8 *)0x0;
  }
  pReadr->iReadOff = iOff;
  lVar6 = pFile->iEof;
  pReadr->iEof = lVar6;
  psVar1 = pFile->pFd;
  pReadr->pFd = psVar1;
  if ((lVar6 <= pTask->pSorter->db->nMaxSorterMmap) && (2 < psVar1->pMethods->iVersion)) {
    iVar3 = (*psVar1->pMethods->xFetch)(psVar1,0,(int)lVar6,&pReadr->aMap);
    if (iVar3 != 0) {
      return iVar3;
    }
    if (pReadr->aMap != (u8 *)0x0) {
      return 0;
    }
  }
  iVar3 = pTask->pSorter->pgsz;
  puVar5 = pReadr->aBuffer;
  lVar6 = pReadr->iReadOff % (long)iVar3;
  iVar4 = 0;
  if (puVar5 == (u8 *)0x0) {
    puVar5 = (u8 *)sqlite3Malloc((long)iVar3);
    pReadr->aBuffer = puVar5;
    iVar4 = 7;
    if (puVar5 != (u8 *)0x0) {
      iVar4 = 0;
    }
    pReadr->nBuffer = iVar3;
  }
  if (lVar6 == 0 || iVar4 != 0) {
    return iVar4;
  }
  iVar3 = iVar3 - (int)lVar6;
  lVar2 = pReadr->iReadOff;
  if (pReadr->iEof < lVar2 + iVar3) {
    iVar3 = (int)pReadr->iEof - (int)lVar2;
  }
  iVar3 = (*pReadr->pFd->pMethods->xRead)(pReadr->pFd,puVar5 + lVar6,iVar3,lVar2);
  return iVar3;
}

Assistant:

static int vdbePmaReaderSeek(
  SortSubtask *pTask,             /* Task context */
  PmaReader *pReadr,              /* Reader whose cursor is to be moved */
  SorterFile *pFile,              /* Sorter file to read from */
  i64 iOff                        /* Offset in pFile */
){
  int rc = SQLITE_OK;

  assert( pReadr->pIncr==0 || pReadr->pIncr->bEof==0 );

  if( sqlite3FaultSim(201) ) return SQLITE_IOERR_READ;
  if( pReadr->aMap ){
    sqlite3OsUnfetch(pReadr->pFd, 0, pReadr->aMap);
    pReadr->aMap = 0;
  }
  pReadr->iReadOff = iOff;
  pReadr->iEof = pFile->iEof;
  pReadr->pFd = pFile->pFd;

  rc = vdbeSorterMapFile(pTask, pFile, &pReadr->aMap);
  if( rc==SQLITE_OK && pReadr->aMap==0 ){
    int pgsz = pTask->pSorter->pgsz;
    int iBuf = pReadr->iReadOff % pgsz;
    if( pReadr->aBuffer==0 ){
      pReadr->aBuffer = (u8*)sqlite3Malloc(pgsz);
      if( pReadr->aBuffer==0 ) rc = SQLITE_NOMEM_BKPT;
      pReadr->nBuffer = pgsz;
    }
    if( rc==SQLITE_OK && iBuf ){
      int nRead = pgsz - iBuf;
      if( (pReadr->iReadOff + nRead) > pReadr->iEof ){
        nRead = (int)(pReadr->iEof - pReadr->iReadOff);
      }
      rc = sqlite3OsRead(
          pReadr->pFd, &pReadr->aBuffer[iBuf], nRead, pReadr->iReadOff
      );
      testcase( rc!=SQLITE_OK );
    }
  }

  return rc;
}